

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O0

int Kit_SopDivisor(Kit_Sop_t *cResult,Kit_Sop_t *cSop,int nLits,Vec_Int_t *vMemory)

{
  int iVar1;
  Vec_Int_t *vMemory_local;
  int nLits_local;
  Kit_Sop_t *cSop_local;
  Kit_Sop_t *cResult_local;
  
  iVar1 = Kit_SopCubeNum(cSop);
  if (iVar1 < 2) {
    cResult_local._4_4_ = 0;
  }
  else {
    iVar1 = Kit_SopAnyLiteral(cSop,nLits);
    if (iVar1 == -1) {
      cResult_local._4_4_ = 0;
    }
    else {
      Kit_SopDup(cResult,cSop,vMemory);
      Kit_SopDivisorZeroKernel_rec(cResult,nLits);
      iVar1 = Kit_SopCubeNum(cResult);
      if (iVar1 < 1) {
        __assert_fail("Kit_SopCubeNum(cResult) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitSop.c"
                      ,0x220,"int Kit_SopDivisor(Kit_Sop_t *, Kit_Sop_t *, int, Vec_Int_t *)");
      }
      cResult_local._4_4_ = 1;
    }
  }
  return cResult_local._4_4_;
}

Assistant:

int Kit_SopDivisor( Kit_Sop_t * cResult, Kit_Sop_t * cSop, int nLits, Vec_Int_t * vMemory )
{
    if ( Kit_SopCubeNum(cSop) <= 1 )
        return 0;
    if ( Kit_SopAnyLiteral( cSop, nLits ) == -1 )
        return 0;
    // duplicate the cover
    Kit_SopDup( cResult, cSop, vMemory );
    // perform the kerneling
    Kit_SopDivisorZeroKernel_rec( cResult, nLits );
    assert( Kit_SopCubeNum(cResult) > 0 );
    return 1;
}